

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_dash.cpp
# Opt level: O3

void __thiscall agg::vcgen_dash::calc_dash_start(vcgen_dash *this,double ds)

{
  double dVar1;
  uint uVar2;
  
  this->m_curr_dash = 0;
  this->m_curr_dash_start = 0.0;
  if (0.0 < ds) {
    uVar2 = 0;
    do {
      dVar1 = this->m_dashes[uVar2];
      if (ds <= dVar1) {
        this->m_curr_dash_start = ds;
        return;
      }
      uVar2 = uVar2 + 1;
      this->m_curr_dash = uVar2;
      this->m_curr_dash_start = 0.0;
      if (this->m_num_dashes <= uVar2) {
        this->m_curr_dash = 0;
        uVar2 = 0;
      }
      ds = ds - dVar1;
    } while (0.0 < ds);
  }
  return;
}

Assistant:

void vcgen_dash::calc_dash_start(double ds)
    {
        m_curr_dash = 0;
        m_curr_dash_start = 0.0;
        while(ds > 0.0)
        {
            if(ds > m_dashes[m_curr_dash])
            {
                ds -= m_dashes[m_curr_dash];
                ++m_curr_dash;
                m_curr_dash_start = 0.0;
                if(m_curr_dash >= m_num_dashes) m_curr_dash = 0;
            }
            else
            {
                m_curr_dash_start = ds;
                ds = 0.0;
            }
        }
    }